

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

int ipc_helper_tcp_connection(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  sockaddr_in addr;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&channel,1);
  if (iVar1 == 0) {
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable(&channel);
    if (iVar1 == 1) {
      iVar1 = uv_is_writable(&channel);
      if (iVar1 == 1) {
        iVar1 = uv_is_closing(&channel);
        if (iVar1 == 0) {
          uVar2 = uv_default_loop();
          iVar1 = uv_tcp_init(uVar2,&tcp_server);
          if (iVar1 == 0) {
            iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
            if (iVar1 == 0) {
              iVar1 = uv_tcp_bind(&tcp_server,&addr,0);
              if (iVar1 == 0) {
                iVar1 = uv_listen(&tcp_server,0x80,ipc_on_connection_tcp_conn);
                if (iVar1 == 0) {
                  uVar2 = uv_default_loop();
                  iVar1 = uv_tcp_init(uVar2,0x2b4f20);
                  if (iVar1 == 0) {
                    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
                    if (iVar1 == 0) {
                      iVar1 = uv_tcp_connect(&conn,0x2b4f20,&addr,connect_child_process_cb);
                      if (iVar1 == 0) {
                        uVar2 = uv_default_loop();
                        iVar1 = uv_run(uVar2,0);
                        if (iVar1 == 0) {
                          if (tcp_conn_read_cb_called == 1) {
                            if (tcp_conn_write_cb_called == 1) {
                              if (close_cb_called == 4) {
                                loop = (uv_loop_t *)uv_default_loop();
                                close_loop(loop);
                                uVar2 = uv_default_loop();
                                iVar1 = uv_loop_close(uVar2);
                                if (iVar1 == 0) {
                                  return 0;
                                }
                                pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                                uVar2 = 0x338;
                              }
                              else {
                                pcVar3 = "close_cb_called == 4";
                                uVar2 = 0x336;
                              }
                            }
                            else {
                              pcVar3 = "tcp_conn_write_cb_called == 1";
                              uVar2 = 0x335;
                            }
                          }
                          else {
                            pcVar3 = "tcp_conn_read_cb_called == 1";
                            uVar2 = 0x334;
                          }
                        }
                        else {
                          pcVar3 = "r == 0";
                          uVar2 = 0x332;
                        }
                      }
                      else {
                        pcVar3 = "r == 0";
                        uVar2 = 0x32f;
                      }
                    }
                    else {
                      pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
                      uVar2 = 0x329;
                    }
                  }
                  else {
                    pcVar3 = "r == 0";
                    uVar2 = 0x327;
                  }
                }
                else {
                  pcVar3 = "r == 0";
                  uVar2 = 0x323;
                }
              }
              else {
                pcVar3 = "r == 0";
                uVar2 = 800;
              }
            }
            else {
              pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
              uVar2 = 0x31d;
            }
          }
          else {
            pcVar3 = "r == 0";
            uVar2 = 0x31b;
          }
        }
        else {
          pcVar3 = "0 == uv_is_closing((uv_handle_t*) &channel)";
          uVar2 = 0x318;
        }
      }
      else {
        pcVar3 = "1 == uv_is_writable((uv_stream_t*) &channel)";
        uVar2 = 0x317;
      }
    }
    else {
      pcVar3 = "1 == uv_is_readable((uv_stream_t*) &channel)";
      uVar2 = 0x316;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x312;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

int ipc_helper_tcp_connection(void) {
  /*
   * This is launched from test-ipc.c. stdin is a duplex channel
   * over which a handle will be transmitted.
   */

  int r;
  struct sockaddr_in addr;

  r = uv_pipe_init(uv_default_loop(), &channel, 1);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  r = uv_tcp_init(uv_default_loop(), &tcp_server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, ipc_on_connection_tcp_conn);
  ASSERT(r == 0);

  /* Make a connection to the server */
  r = uv_tcp_init(uv_default_loop(), &conn.conn);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_connect(&conn.conn_req,
                     (uv_tcp_t*) &conn.conn,
                     (const struct sockaddr*) &addr,
                     connect_child_process_cb);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(tcp_conn_read_cb_called == 1);
  ASSERT(tcp_conn_write_cb_called == 1);
  ASSERT(close_cb_called == 4);

  MAKE_VALGRIND_HAPPY();
  return 0;
}